

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip4.c
# Opt level: O1

Curl_addrinfo * Curl_getaddrinfo(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_addrinfo *pCVar1;
  
  *waitp = 0;
  pCVar1 = Curl_ipv4_resolve_r(hostname,port);
  if (pCVar1 == (Curl_addrinfo *)0x0) {
    Curl_infof(conn->data,"Curl_ipv4_resolve_r failed for %s\n",hostname);
  }
  return pCVar1;
}

Assistant:

Curl_addrinfo *Curl_getaddrinfo(struct connectdata *conn,
                                const char *hostname,
                                int port,
                                int *waitp)
{
  Curl_addrinfo *ai = NULL;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)conn;
#endif

  *waitp = 0; /* synchronous response only */

  ai = Curl_ipv4_resolve_r(hostname, port);
  if(!ai)
    infof(conn->data, "Curl_ipv4_resolve_r failed for %s\n", hostname);

  return ai;
}